

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O2

void __thiscall
amrex::MLLinOp::setDomainBC
          (MLLinOp *this,
          Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
          *a_lobc,Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *a_hibc)

{
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *this_00;
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  *this_01;
  pointer paVar1;
  pointer paVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  int line;
  ulong uVar7;
  long lVar8;
  char *EX;
  int idim;
  ulong uVar9;
  long lVar10;
  
  uVar4 = (*this->_vptr_MLLinOp[5])();
  if ((((long)(a_lobc->
              super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ).
              super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(a_lobc->
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ).
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0xc != (long)(int)uVar4) ||
     (((long)(a_hibc->
             super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ).
             super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
      (long)(a_hibc->
            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ).
            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start) / 0xc != (long)(int)uVar4)) {
    Assert_host("ncomp == a_lobc.size() && ncomp == a_hibc.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLLinOp.cpp"
                ,0x242,"\"MLLinOp::setDomainBC: wrong size\"");
  }
  this_00 = &this->m_lobc;
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator=(&this_00->
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ,&a_lobc->
                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             );
  this_01 = &this->m_hibc;
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator=(&this_01->
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ,&a_hibc->
                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             );
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator=(&(this->m_lobc_orig).
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ,&this_00->
                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             );
  std::
  vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator=(&(this->m_hibc_orig).
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
              ,&this_01->
                super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
             );
  uVar7 = 0;
  uVar9 = (ulong)uVar4;
  if ((int)uVar4 < 1) {
    uVar9 = uVar7;
  }
  uVar6 = 0;
  do {
    if (uVar6 == uVar9) {
      uVar7 = (ulong)(uint)(this->info).hidden_direction;
      if (uVar7 < 3) {
        lVar10 = uVar7 * 4;
        paVar1 = (this_00->
                 super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                 ).
                 super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        paVar2 = (this_01->
                 super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                 ).
                 super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (lVar8 = 0; uVar9 * 0xc - lVar8 != 0; lVar8 = lVar8 + 0xc) {
          *(undefined4 *)((long)paVar1->_M_elems + lVar8 + lVar10) = 0x66;
          *(undefined4 *)((long)paVar2->_M_elems + lVar8 + lVar10) = 0x66;
        }
      }
      bVar3 = hasInhomogNeumannBC(this);
      if ((bVar3) && (iVar5 = (*this->_vptr_MLLinOp[0x41])(this), (char)iVar5 == '\0')) {
        Abort_host("Inhomogeneous Neumann BC not supported");
      }
      bVar3 = hasRobinBC(this);
      if ((bVar3) && (iVar5 = (*this->_vptr_MLLinOp[0x40])(this), (char)iVar5 == '\0')) {
        Abort_host("Robin BC not supported");
      }
      return;
    }
    for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
      iVar5 = *(int *)((long)((this->m_lobc).
                              super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              .
                              super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                      lVar10 * 4 + uVar7);
      if (*(char *)(*(long *)&(((this->m_geom).
                                super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                .
                                super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>).
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                    + 0x51 + lVar10) == '\x01') {
        line = 0x24b;
        if (iVar5 != 200) {
          EX = "m_lobc[icomp][idim] == BCType::Periodic && m_hibc[icomp][idim] == BCType::Periodic";
          goto LAB_004ea2d4;
        }
        EX = "m_lobc[icomp][idim] == BCType::Periodic && m_hibc[icomp][idim] == BCType::Periodic";
        if (*(int *)((long)((this_01->
                            super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            ).
                            super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                    lVar10 * 4 + uVar7) != 200) goto LAB_004ea2d4;
      }
      else {
        line = 0x24e;
        if (iVar5 == 200) {
          EX = "m_lobc[icomp][idim] != BCType::Periodic && m_hibc[icomp][idim] != BCType::Periodic";
        }
        else {
          EX = "m_lobc[icomp][idim] != BCType::Periodic && m_hibc[icomp][idim] != BCType::Periodic";
          if (*(int *)((long)((this_01->
                              super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              ).
                              super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->_M_elems +
                      lVar10 * 4 + uVar7) != 200) goto LAB_004ea2de;
        }
LAB_004ea2d4:
        Assert_host(EX,
                    "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/LinearSolvers/MLMG/AMReX_MLLinOp.cpp"
                    ,line,(char *)0x0);
      }
LAB_004ea2de:
      paVar1 = (this_00->
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ).
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)paVar1->_M_elems + lVar10 * 4 + uVar7) - 0x6bU < 2) {
        *(undefined4 *)((long)paVar1->_M_elems + lVar10 * 4 + uVar7) = 0x66;
      }
      paVar1 = (this_01->
               super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ).
               super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)paVar1->_M_elems + lVar10 * 4 + uVar7) - 0x6bU < 2) {
        *(undefined4 *)((long)paVar1->_M_elems + lVar10 * 4 + uVar7) = 0x66;
      }
    }
    uVar6 = uVar6 + 1;
    uVar7 = uVar7 + 0xc;
  } while( true );
}

Assistant:

void
MLLinOp::setDomainBC (const Vector<Array<BCType,AMREX_SPACEDIM> >& a_lobc,
                      const Vector<Array<BCType,AMREX_SPACEDIM> >& a_hibc) noexcept
{
    const int ncomp = getNComp();
    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(ncomp == a_lobc.size() && ncomp == a_hibc.size(),
                                     "MLLinOp::setDomainBC: wrong size");
    m_lobc = a_lobc;
    m_hibc = a_hibc;
    m_lobc_orig = m_lobc;
    m_hibc_orig = m_hibc;
    for (int icomp = 0; icomp < ncomp; ++icomp) {
        for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
            if (m_geom[0][0].isPeriodic(idim)) {
                AMREX_ALWAYS_ASSERT(m_lobc[icomp][idim] == BCType::Periodic &&
                                    m_hibc[icomp][idim] == BCType::Periodic);
            } else {
                AMREX_ALWAYS_ASSERT(m_lobc[icomp][idim] != BCType::Periodic &&
                                    m_hibc[icomp][idim] != BCType::Periodic);
            }

            if (m_lobc[icomp][idim] == LinOpBCType::inhomogNeumann ||
                m_lobc[icomp][idim] == LinOpBCType::Robin)
            {
                m_lobc[icomp][idim] = LinOpBCType::Neumann;
            }

            if (m_hibc[icomp][idim] == LinOpBCType::inhomogNeumann ||
                m_hibc[icomp][idim] == LinOpBCType::Robin)
            {
                m_hibc[icomp][idim] = LinOpBCType::Neumann;
            }
        }
    }

    if (hasHiddenDimension()) {
        const int hd = hiddenDirection();
        for (int n = 0; n < ncomp; ++n) {
            m_lobc[n][hd] = LinOpBCType::Neumann;
            m_hibc[n][hd] = LinOpBCType::Neumann;
        }
    }

    if (hasInhomogNeumannBC() && !supportInhomogNeumannBC()) {
        amrex::Abort("Inhomogeneous Neumann BC not supported");
    }
    if (hasRobinBC() && !supportRobinBC()) {
        amrex::Abort("Robin BC not supported");
    }
}